

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBlock,_3UL>::Construct
                   (DB *db,LIST *params)

{
  IfcBlock *in;
  
  in = (IfcBlock *)operator_new(0x78);
  *(undefined ***)&in->field_0x60 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x68 = 0;
  *(char **)&in->field_0x70 = "IfcBlock";
  Assimp::IFC::Schema_2x3::IfcCsgPrimitive3D::IfcCsgPrimitive3D
            ((IfcCsgPrimitive3D *)in,&PTR_construction_vtable_24__00894918);
  *(undefined8 *)&(in->super_IfcCsgPrimitive3D).field_0x40 = 0;
  (in->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcBlock_00894860;
  *(undefined ***)&in->field_0x60 = &PTR__IfcBlock_00894900;
  *(undefined ***)
   &(in->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcBlock_00894888;
  *(undefined ***)
   &(in->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcBlock_008948b0;
  *(undefined ***)&(in->super_IfcCsgPrimitive3D).field_0x38 = &PTR__IfcBlock_008948d8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcBlock>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }